

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O0

bool iDynTree::CompositeRigidBodyAlgorithm
               (Model *model,Traversal *traversal,JointPosDoubleArray *jointPos,
               LinkCompositeRigidBodyInertias *linkCRBs,FreeFloatingMassMatrix *massMatrix)

{
  undefined8 uVar1;
  IJoint *pIVar2;
  uint uVar3;
  SpatialVector<iDynTree::SpatialMotionVector> *pSVar4;
  uint uVar5;
  int iVar6;
  SpatialInertia *pSVar7;
  undefined4 extraout_var;
  LinkIndex LVar8;
  undefined4 extraout_var_00;
  double *pdVar9;
  Link *pLVar10;
  LinkIndex LVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar12;
  undefined4 extraout_var_03;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_> *in_RCX;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDX;
  ulong in_R8;
  double dVar13;
  Matrix6x6 lockedInertia;
  Matrix<double,_6,_1,_0,_6,_1> FEigen;
  Transform ancestorParent_X_ancestor_1;
  LinkIndex ancestorParent_1;
  IJointConstPtr ancestorToParentJoint_2;
  size_t ancestorDofIndex;
  SpatialMotionVector S_ancestorDof;
  LinkIndex ancestorParentIndex;
  IJointConstPtr ancestorToParentJoint;
  Transform ancestorParent_X_ancestor;
  LinkIndex ancestorParent;
  IJointConstPtr ancestorToParentJoint_1;
  LinkConstPtr ancestor;
  size_t dofIndex;
  SpatialForceVector F;
  SpatialMotionVector S_visitedDof;
  LinkIndex parentLinkIndex;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkIndex visitedLinkIndex_1;
  LinkConstPtr visitedLink_1;
  int traversalEl_1;
  LinkIndex visitedLinkIndex;
  LinkConstPtr visitedLink;
  uint traversalEl;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> massMatrixEigen;
  SpatialInertia *in_stack_fffffffffffff838;
  SpatialInertia *in_stack_fffffffffffff840;
  SpatialInertia *in_stack_fffffffffffff848;
  Transform *in_stack_fffffffffffff850;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff858;
  SpatialVector<iDynTree::SpatialMotionVector> *in_stack_fffffffffffff860;
  SpatialForceVector *in_stack_fffffffffffff8c8;
  undefined1 local_380 [152];
  LinkIndex local_2e8;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *local_2e0;
  long local_2d8;
  undefined1 local_2d0 [48];
  LinkIndex local_2a0;
  IJoint *local_298;
  Transform local_290 [56];
  Transform local_258 [96];
  LinkIndex local_1f8;
  IJoint *local_1f0;
  Link *local_1e8;
  long local_1d0;
  SpatialInertia local_1c8;
  Transform local_160 [104];
  SpatialInertia local_f8;
  LinkIndex local_90;
  IJoint *local_88;
  Link *local_80;
  LinkIndex local_78;
  Link *local_70;
  uint local_64;
  LinkIndex local_60;
  Link *local_58;
  uint local_50;
  ulong local_28;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_> *local_20;
  SpatialVector<iDynTree::SpatialMotionVector> *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  iDynTree::MatrixDynSize::cols();
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffff840);
  Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffff860,(PointerArgType)in_stack_fffffffffffff858,
             (Index)in_stack_fffffffffffff850,(Index)in_stack_fffffffffffff848,
             (Stride<0,_0> *)in_stack_fffffffffffff840);
  for (local_50 = 0; uVar3 = local_50, uVar5 = Traversal::getNrOfVisitedLinks((Traversal *)0x3bb14e)
      , uVar3 < uVar5; local_50 = local_50 + 1) {
    local_58 = Traversal::getLink((Traversal *)in_stack_fffffffffffff840,
                                  (TraversalIndex)in_stack_fffffffffffff838);
    local_60 = Link::getIndex(local_58);
    Link::getInertia(local_58);
    LinkInertias::operator()
              ((LinkInertias *)in_stack_fffffffffffff840,(LinkIndex)in_stack_fffffffffffff838);
    SpatialInertia::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  }
  local_64 = Traversal::getNrOfVisitedLinks((Traversal *)0x3bb1ef);
  while (local_64 = local_64 - 1, -1 < (int)local_64) {
    local_70 = Traversal::getLink((Traversal *)in_stack_fffffffffffff840,
                                  (TraversalIndex)in_stack_fffffffffffff838);
    local_78 = Link::getIndex(local_70);
    local_80 = Traversal::getParentLink
                         ((Traversal *)in_stack_fffffffffffff840,
                          (TraversalIndex)in_stack_fffffffffffff838);
    local_88 = Traversal::getParentJoint
                         ((Traversal *)in_stack_fffffffffffff840,
                          (TraversalIndex)in_stack_fffffffffffff838);
    if (local_80 != (Link *)0x0) {
      local_90 = Link::getIndex(local_80);
      pSVar7 = LinkInertias::operator()
                         ((LinkInertias *)in_stack_fffffffffffff840,
                          (LinkIndex)in_stack_fffffffffffff838);
      iVar6 = (*local_88->_vptr_IJoint[10])(local_88,local_18,local_90,local_78);
      LinkInertias::operator()
                ((LinkInertias *)in_stack_fffffffffffff840,(LinkIndex)in_stack_fffffffffffff838);
      iDynTree::Transform::operator*(local_160,(SpatialInertia *)CONCAT44(extraout_var,iVar6));
      iDynTree::SpatialInertia::operator+(&local_f8,pSVar7);
      LinkInertias::operator()
                ((LinkInertias *)in_stack_fffffffffffff840,(LinkIndex)in_stack_fffffffffffff838);
      SpatialInertia::operator=(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      iVar6 = (*local_88->_vptr_IJoint[4])();
      pIVar2 = local_88;
      if (iVar6 == 1) {
        LVar8 = Link::getIndex(local_70);
        (*pIVar2->_vptr_IJoint[0xc])(&local_1c8.field_0x38,pIVar2,0,LVar8,local_90);
        pSVar7 = LinkInertias::operator()
                           ((LinkInertias *)in_stack_fffffffffffff840,
                            (LinkIndex)in_stack_fffffffffffff838);
        iDynTree::SpatialInertia::operator*(&local_1c8,(SpatialMotionVector *)pSVar7);
        iVar6 = (*local_88->_vptr_IJoint[0x18])();
        local_1d0 = CONCAT44(extraout_var_00,iVar6);
        dVar13 = SpatialVector<iDynTree::SpatialMotionVector>::dot
                           (in_stack_fffffffffffff860,(DualVectorT *)in_stack_fffffffffffff858);
        pdVar9 = (double *)iDynTree::MatrixDynSize::operator()(local_28,local_1d0 + 6);
        *pdVar9 = dVar13;
        local_1e8 = local_70;
        while( true ) {
          Link::getIndex(local_1e8);
          pLVar10 = Traversal::getParentLinkFromLinkIndex
                              ((Traversal *)in_stack_fffffffffffff840,
                               (LinkIndex)in_stack_fffffffffffff838);
          Link::getIndex(pLVar10);
          pLVar10 = Traversal::getParentLinkFromLinkIndex
                              ((Traversal *)in_stack_fffffffffffff840,
                               (LinkIndex)in_stack_fffffffffffff838);
          if (pLVar10 == (Link *)0x0) break;
          Link::getIndex(local_1e8);
          local_1f0 = Traversal::getParentJointFromLinkIndex
                                ((Traversal *)in_stack_fffffffffffff840,
                                 (LinkIndex)in_stack_fffffffffffff838);
          Link::getIndex(local_1e8);
          pLVar10 = Traversal::getParentLinkFromLinkIndex
                              ((Traversal *)in_stack_fffffffffffff840,
                               (LinkIndex)in_stack_fffffffffffff838);
          LVar8 = Link::getIndex(pLVar10);
          pSVar4 = local_18;
          pIVar2 = local_1f0;
          local_1f8 = LVar8;
          LVar11 = Link::getIndex(local_1e8);
          iVar6 = (*pIVar2->_vptr_IJoint[10])(pIVar2,pSVar4,LVar8,LVar11);
          iDynTree::Transform::Transform(local_258,(Transform *)CONCAT44(extraout_var_01,iVar6));
          iDynTree::Transform::operator*(local_290,(SpatialForceVector *)local_258);
          SpatialForceVector::operator=
                    ((SpatialForceVector *)in_stack_fffffffffffff840,
                     (SpatialForceVector *)in_stack_fffffffffffff838);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_290);
          Link::getIndex(local_1e8);
          local_1e8 = Traversal::getParentLinkFromLinkIndex
                                ((Traversal *)in_stack_fffffffffffff840,
                                 (LinkIndex)in_stack_fffffffffffff838);
          Link::getIndex(local_1e8);
          local_298 = Traversal::getParentJointFromLinkIndex
                                ((Traversal *)in_stack_fffffffffffff840,
                                 (LinkIndex)in_stack_fffffffffffff838);
          Link::getIndex(local_1e8);
          pLVar10 = Traversal::getParentLinkFromLinkIndex
                              ((Traversal *)in_stack_fffffffffffff840,
                               (LinkIndex)in_stack_fffffffffffff838);
          local_2a0 = Link::getIndex(pLVar10);
          iVar6 = (*local_298->_vptr_IJoint[4])();
          pIVar2 = local_298;
          if (iVar6 == 1) {
            LVar8 = Link::getIndex(local_1e8);
            (*pIVar2->_vptr_IJoint[0xc])(local_2d0,pIVar2,0,LVar8,local_2a0);
            iVar6 = (*local_298->_vptr_IJoint[0x18])();
            local_2d8 = CONCAT44(extraout_var_02,iVar6);
            dVar13 = SpatialVector<iDynTree::SpatialMotionVector>::dot
                               (in_stack_fffffffffffff860,(DualVectorT *)in_stack_fffffffffffff858);
            in_stack_fffffffffffff8c8 =
                 (SpatialForceVector *)iDynTree::MatrixDynSize::operator()(local_28,local_1d0 + 6);
            *(double *)in_stack_fffffffffffff8c8 = dVar13;
            puVar12 = (undefined8 *)iDynTree::MatrixDynSize::operator()(local_28,local_1d0 + 6);
            uVar1 = *puVar12;
            puVar12 = (undefined8 *)iDynTree::MatrixDynSize::operator()(local_28,local_2d8 + 6);
            *puVar12 = uVar1;
          }
        }
        Link::getIndex(local_1e8);
        local_2e0 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)Traversal::getParentJointFromLinkIndex
                                 ((Traversal *)in_stack_fffffffffffff840,
                                  (LinkIndex)in_stack_fffffffffffff838);
        Link::getIndex(local_1e8);
        pLVar10 = Traversal::getParentLinkFromLinkIndex
                            ((Traversal *)in_stack_fffffffffffff840,
                             (LinkIndex)in_stack_fffffffffffff838);
        LVar8 = Link::getIndex(pLVar10);
        in_stack_fffffffffffff858 = local_2e0;
        in_stack_fffffffffffff860 = local_18;
        local_2e8 = LVar8;
        LVar11 = Link::getIndex(local_1e8);
        iVar6 = (*(*(_func_int ***)in_stack_fffffffffffff858)[10])
                          (in_stack_fffffffffffff858,in_stack_fffffffffffff860,LVar8,LVar11);
        in_stack_fffffffffffff850 = (Transform *)CONCAT44(extraout_var_03,iVar6);
        iDynTree::Transform::Transform((Transform *)(local_380 + 0x38),in_stack_fffffffffffff850);
        iDynTree::Transform::operator*
                  ((Transform *)local_380,(SpatialForceVector *)(local_380 + 0x38));
        in_stack_fffffffffffff848 = &local_1c8;
        in_stack_fffffffffffff840 = (SpatialInertia *)local_380;
        SpatialForceVector::operator=
                  ((SpatialForceVector *)in_stack_fffffffffffff840,
                   (SpatialForceVector *)in_stack_fffffffffffff838);
        iDynTree::SpatialForceVector::~SpatialForceVector
                  ((SpatialForceVector *)in_stack_fffffffffffff840);
        toEigen(in_stack_fffffffffffff8c8);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<6,1>(in_stack_fffffffffffff858,(Index)in_stack_fffffffffffff850,
                   (Index)in_stack_fffffffffffff848);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,6,1,false>
        ::operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_6,_1,_false>
                     *)in_stack_fffffffffffff840,
                    (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff838);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<1,6>(in_stack_fffffffffffff858,(Index)in_stack_fffffffffffff850,
                   (Index)in_stack_fffffffffffff848);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,1,6,false>
        ::operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>
                     *)in_stack_fffffffffffff840,
                    (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff838);
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&local_1c8);
      }
    }
  }
  pLVar10 = Traversal::getLink((Traversal *)in_stack_fffffffffffff840,(TraversalIndex)local_20);
  Link::getIndex(pLVar10);
  LinkInertias::operator()((LinkInertias *)in_stack_fffffffffffff840,(LinkIndex)local_20);
  iDynTree::SpatialInertia::asMatrix();
  toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffff858);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::block<6,6>
            (in_stack_fffffffffffff858,(Index)in_stack_fffffffffffff850,
             (Index)in_stack_fffffffffffff848);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,6,6,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_6,_6,_false>
             *)in_stack_fffffffffffff840,local_20);
  return true;
}

Assistant:

bool CompositeRigidBodyAlgorithm(const Model& model,
                                 const Traversal& traversal,
                                 const JointPosDoubleArray& jointPos,
                                 LinkCompositeRigidBodyInertias& linkCRBs,
                                 FreeFloatingMassMatrix& massMatrix)
{
    // Map the massMatrix to an Eigen matrix
    Eigen::Map<Eigen::Matrix<double,Eigen::Dynamic,Eigen::Dynamic,Eigen::RowMajor> >
        massMatrixEigen(massMatrix.data(),massMatrix.rows(),massMatrix.cols());

    /**
     * Forward pass: initialize the CRBI
     * of each link to its own inertia.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        linkCRBs(visitedLinkIndex) = visitedLink->getInertia();
    }

    /**
     * Backward pass: for each link compute the
     * CRB of the link (given the traversal).
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // If the visited link is not the base one, add its
        // CRBI to the CRBI of the parent
        // \todo TODO streamline the check "is Link the floating base"
        // given a traversal
        if( parentLink )
        {
            LinkIndex parentLinkIndex = parentLink->getIndex();

            linkCRBs(parentLinkIndex) = linkCRBs(parentLinkIndex) +
                (toParentJoint->getTransform(jointPos,parentLinkIndex,visitedLinkIndex))*linkCRBs(visitedLinkIndex);

            // For now we just implement the CRBA for 0 or 1 dofs joints.
            assert( toParentJoint->getNrOfDOFs() <= 1 );

            // If the visited link is attached to its parent with a fixed joint,
            // we don't need to do anything else for this link.
            // Otherwise we need to compute the rows and columns of the mass matrix
            // related to the dof connecting the visited link to its parent
            if( toParentJoint->getNrOfDOFs() == 1 )
            {
                // In this loop we follow the algorith as described in
                // in Featherstone 2008 , Table 6.2 . In particular S_visitedDof (S_i in the book)
                // is the motion subspace vector connected to the degree of freedom connecting the link to its parent,
                // while S_ancestorDof (S_j in the book) is the motion subspace vector of its ancestor considered in the
                // inner loop
                SpatialMotionVector S_visitedDof = toParentJoint->getMotionSubspaceVector(0,visitedLink->getIndex(),parentLinkIndex);
                SpatialForceVector  F = linkCRBs(visitedLinkIndex)*S_visitedDof;

                // We compute the term of the mass matrix on the diagonal
                // (in the book: H_ii = S_i^\top F
                size_t dofIndex = toParentJoint->getDOFsOffset();
                massMatrix(6+dofIndex,6+dofIndex) = S_visitedDof.dot(F);

                // Then we compute all the off-diagonal terms relative to
                // the ancestors of the currently visited link

                // j = i
                LinkConstPtr ancestor = visitedLink;

                // while lambda(j) != 0
                while( traversal.getParentLinkFromLinkIndex(traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex()) )
                {
                    {
                        IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                        LinkIndex      ancestorParent =        traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();
                        Transform ancestorParent_X_ancestor = ancestorToParentJoint->getTransform(jointPos,ancestorParent,ancestor->getIndex());
                        F = ancestorParent_X_ancestor*F;
                    }

                    // j = \lambda(j)

                    ancestor = traversal.getParentLinkFromLinkIndex(ancestor->getIndex());

                    IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                    LinkIndex      ancestorParentIndex   = traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();

                    // For now we just implement the CRBA for 0 or 1 dofs joints.
                    assert( ancestorToParentJoint->getNrOfDOFs() <= 1 );

                    if( ancestorToParentJoint->getNrOfDOFs() == 1 )
                    {
                        SpatialMotionVector S_ancestorDof =
                            ancestorToParentJoint->getMotionSubspaceVector(0,ancestor->getIndex(),ancestorParentIndex);
                        size_t ancestorDofIndex = ancestorToParentJoint->getDOFsOffset();

                        // H_ij = F^\top S_j
                        // H_ji = H_ij^\top
                        massMatrix(6+dofIndex,6+ancestorDofIndex) = S_ancestorDof.dot(F);
                        massMatrix(6+ancestorDofIndex,6+dofIndex) = massMatrix(6+dofIndex,6+ancestorDofIndex);
                    }
                }

                // We need to write F in the base link for the off-diagonal term of the mass matrix
                {
                    IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                    LinkIndex      ancestorParent =        traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();
                    Transform ancestorParent_X_ancestor = ancestorToParentJoint->getTransform(jointPos,ancestorParent,ancestor->getIndex());
                    F = ancestorParent_X_ancestor*F;
                }

                // Fill the 6 \times nDof right top submatrix of the mass matrix
                // (i.e. the jacobian of the momentum)
                Eigen::Matrix<double,6,1> FEigen = toEigen(F);
                massMatrixEigen.block<6,1>(0,6+dofIndex) = FEigen;
                massMatrixEigen.block<1,6>(6+dofIndex,0) = FEigen;
            }

        }
    }

    // Fill the top left 6x6 matrix: it is just the composite rigid body inertia of all the body
    Matrix6x6 lockedInertia = linkCRBs(traversal.getLink(0)->getIndex()).asMatrix();
    massMatrixEigen.block<6,6>(0,0) = toEigen(lockedInertia);

    return true;
}